

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O3

void __thiscall Diligent::ArchiverImpl::Reset(ArchiverImpl *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_SignaturesMtx);
  if (iVar1 == 0) {
    std::
    _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->m_Signatures)._M_h);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_SignaturesMtx);
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_RenderPassesMtx);
    if (iVar1 == 0) {
      std::
      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedRenderPassImpl>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedRenderPassImpl>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(this->m_RenderPasses)._M_h);
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_RenderPassesMtx);
      iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_PipelinesMtx);
      if (iVar1 == 0) {
        std::
        _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::clear(&(this->m_Pipelines)._M_h);
        pthread_mutex_unlock((pthread_mutex_t *)&this->m_PipelinesMtx);
        iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_ShadersMtx);
        if (iVar1 == 0) {
          std::
          _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::clear(&(this->m_Shaders)._M_h);
          pthread_mutex_unlock((pthread_mutex_t *)&this->m_ShadersMtx);
          return;
        }
      }
    }
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ArchiverImpl::Reset()
{
    {
        std::lock_guard<std::mutex> Guard{m_SignaturesMtx};
        m_Signatures.clear();
    }

    {
        std::lock_guard<std::mutex> Guard{m_RenderPassesMtx};
        m_RenderPasses.clear();
    }

    {
        std::lock_guard<std::mutex> Guard{m_PipelinesMtx};
        m_Pipelines.clear();
    }

    {
        std::lock_guard<std::mutex> Guard{m_ShadersMtx};
        m_Shaders.clear();
    }
}